

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
LinkGroupNode::Evaluate
          (string *__return_storage_ptr__,LinkGroupNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  cmAlphaNum *this_00;
  string_view separator;
  string_view separator_00;
  char local_ea [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string LG_END;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string LG_BEGIN;
  cmStringRange local_30;
  
  if (((dagChecker == (cmGeneratorExpressionDAGChecker *)0x0) ||
      (context->HeadTarget == (cmGeneratorTarget *)0x0)) ||
     (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                        (dagChecker,(cmGeneratorTarget *)0x0,LINK_GROUP), !bVar2)) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&local_80,content);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,
               "$<LINK_GROUP:...> may only be used with binary targets to specify group of link libraries through \'LINK_LIBRARIES\', \'INTERFACE_LINK_LIBRARIES\', and \'INTERFACE_LINK_LIBRARIES_DIRECT\' properties."
               ,(allocator<char> *)&LG_BEGIN);
    reportError(context,(string *)&local_80,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_80);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmExpandLists<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,&list);
  if (list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&local_80,content);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"$<LINK_GROUP:...> expects a feature name as first argument.",
               (allocator<char> *)&LG_BEGIN);
    reportError(context,(string *)&local_80,(string *)&local_b0);
LAB_004728fc:
    std::__cxx11::string::~string((string *)&local_b0);
    this_00 = &local_80;
LAB_0047290b:
    std::__cxx11::string::~string((string *)this_00);
  }
  else {
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<LinkGroupNode::Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)const::_lambda(std::__cxx11::string_const&)_1_>>
                      ();
    if (_Var4._M_current !=
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&local_80,content);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"$<LINK_GROUP:...> cannot be nested.",
                 (allocator<char> *)&LG_BEGIN);
      reportError(context,(string *)&local_80,(string *)&local_b0);
      goto LAB_004728fc;
    }
    if ((long)_Var4._M_current -
        (long)list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
           ::featureNameValidator == '\0') &&
         (iVar3 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                       ::featureNameValidator), iVar3 != 0)) {
        cmsys::RegularExpression::RegularExpression
                  (&Evaluate::featureNameValidator,"^[A-Za-z0-9_]+$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::featureNameValidator,
                     &__dso_handle);
        __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                             ::featureNameValidator);
      }
      pbVar1 = list.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = cmsys::RegularExpression::find
                        (&Evaluate::featureNameValidator,
                         list.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      if (bVar2) {
        local_80.View_._M_len = 0xc;
        local_80.View_._M_str = "<LINK_GROUP:";
        local_b0.View_._M_str = (pbVar1->_M_dataplus)._M_p;
        local_b0.View_._M_len = pbVar1->_M_string_length;
        local_ea[0] = ':';
        local_30.Begin._M_current =
             list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
        local_30.End._M_current =
             list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        separator._M_str = "|";
        separator._M_len = 1;
        cmJoin(&LG_END,&local_30,separator,(string_view)ZEXT816(0));
        local_ea[1] = 0x3e;
        cmStrCat<char,std::__cxx11::string,char>
                  (&LG_BEGIN,&local_80,&local_b0,local_ea,&LG_END,local_ea + 1);
        std::__cxx11::string::~string((string *)&LG_END);
        local_80.View_._M_len = 0xd;
        local_80.View_._M_str = "</LINK_GROUP:";
        local_b0.View_._M_str = (pbVar1->_M_dataplus)._M_p;
        local_b0.View_._M_len = pbVar1->_M_string_length;
        local_30.Begin._M_current._0_1_ = 0x3e;
        cmStrCat<char>(&LG_END,&local_80,&local_b0,(char *)&local_30);
        std::__cxx11::string::_M_assign
                  ((string *)
                   list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&list,&LG_END);
        separator_00._M_str = ";";
        separator_00._M_len = 1;
        cmJoin(__return_storage_ptr__,&list,separator_00,(string_view)ZEXT816(0));
        std::__cxx11::string::~string((string *)&LG_END);
        std::__cxx11::string::~string((string *)&LG_BEGIN);
        goto LAB_00472920;
      }
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&LG_BEGIN,content);
      local_80.View_._M_len = 0x12;
      local_80.View_._M_str = "The feature name \'";
      local_b0.View_._M_str = (pbVar1->_M_dataplus)._M_p;
      local_b0.View_._M_len = pbVar1->_M_string_length;
      cmStrCat<char[31]>(&LG_END,&local_80,&local_b0,
                         (char (*) [31])"\' contains invalid characters.");
      reportError(context,&LG_BEGIN,&LG_END);
      std::__cxx11::string::~string((string *)&LG_END);
      this_00 = (cmAlphaNum *)&LG_BEGIN;
      goto LAB_0047290b;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_00472920:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&list);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    using ForGenex = cmGeneratorExpressionDAGChecker::ForGenex;

    if (!context->HeadTarget || !dagChecker ||
        !dagChecker->EvaluatingLinkLibraries(nullptr, ForGenex::LINK_GROUP)) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<LINK_GROUP:...> may only be used with binary targets "
        "to specify group of link libraries through 'LINK_LIBRARIES', "
        "'INTERFACE_LINK_LIBRARIES', and "
        "'INTERFACE_LINK_LIBRARIES_DIRECT' properties.");
      return std::string();
    }

    std::vector<std::string> list;
    cmExpandLists(parameters.begin(), parameters.end(), list);
    if (list.empty()) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<LINK_GROUP:...> expects a feature name as first argument.");
      return std::string();
    }
    // $<LINK_GROUP:..> cannot be nested
    if (std::find_if(list.cbegin(), list.cend(),
                     [](const std::string& item) -> bool {
                       return cmHasPrefix(item, "<LINK_GROUP"_s);
                     }) != list.cend()) {
      reportError(context, content->GetOriginalExpression(),
                  "$<LINK_GROUP:...> cannot be nested.");
      return std::string();
    }
    if (list.size() == 1) {
      // no libraries specified, ignore this genex
      return std::string();
    }

    static cmsys::RegularExpression featureNameValidator("^[A-Za-z0-9_]+$");
    auto const& feature = list.front();
    if (!featureNameValidator.find(feature)) {
      reportError(context, content->GetOriginalExpression(),
                  cmStrCat("The feature name '", feature,
                           "' contains invalid characters."));
      return std::string();
    }

    const auto LG_BEGIN = cmStrCat(
      "<LINK_GROUP:", feature, ':',
      cmJoin(cmRange<decltype(list.cbegin())>(list.cbegin() + 1, list.cend()),
             "|"_s),
      '>');
    const auto LG_END = cmStrCat("</LINK_GROUP:", feature, '>');

    list.front() = LG_BEGIN;
    list.push_back(LG_END);

    return cmJoin(list, ";"_s);
  }